

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

void duckdb::BitStringAggOperation::
     Combine<duckdb::BitAggState<short>,duckdb::BitStringAggOperation>
               (BitAggState<short> *source,BitAggState<short> *target,AggregateInputData *param_3)

{
  undefined4 uVar1;
  ulong uVar2;
  char *__src;
  short sVar3;
  char *__dest;
  
  if (source->is_set == true) {
    if (target->is_set != false) {
      Bit::BitwiseOr(&source->value,&target->value,&target->value);
      return;
    }
    uVar2 = *(ulong *)&(source->value).value;
    __src = (source->value).value.pointer.ptr;
    if ((uint)uVar2 < 0xd) {
      *(ulong *)&(target->value).value = uVar2;
      __dest = __src;
    }
    else {
      __dest = (char *)operator_new__(uVar2 & 0xffffffff);
      switchD_01602a8a::default(__dest,__src,uVar2 & 0xffffffff);
      uVar1 = *(undefined4 *)__dest;
      (target->value).value.pointer.length = (uint)uVar2;
      *(undefined4 *)((long)&(target->value).value + 4) = uVar1;
    }
    (target->value).value.pointer.ptr = __dest;
    target->is_set = true;
    sVar3 = source->max;
    target->min = source->min;
    target->max = sVar3;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			return;
		}
		if (!target.is_set) {
			Assign(target, source.value);
			target.is_set = true;
			target.min = source.min;
			target.max = source.max;
		} else {
			Bit::BitwiseOr(source.value, target.value, target.value);
		}
	}